

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_getFrameHeader_advanced
                 (ZSTD_frameHeader *zfhPtr,void *src,size_t srcSize,ZSTD_format_e format)

{
  byte bVar1;
  U16 UVar2;
  U32 UVar3;
  uint uVar4;
  uint uVar5;
  U32 UVar6;
  size_t sVar7;
  ZSTD_format_e in_ECX;
  ulong in_RDX;
  long in_RSI;
  ulong *in_RDI;
  U32 windowLog;
  BYTE wlByte;
  U64 frameContentSize;
  U32 dictID;
  U64 windowSize;
  U32 fcsID;
  U32 singleSegment;
  U32 checksumFlag;
  U32 dictIDSizeCode;
  size_t pos;
  BYTE fhdByte;
  size_t fhsize;
  size_t minInputSize;
  BYTE *ip;
  void *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff88;
  ZSTD_format_e format_00;
  U64 UVar8;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  void *in_stack_ffffffffffffff98;
  ulong uVar9;
  size_t local_50;
  size_t local_8;
  
  format_00 = (ZSTD_format_e)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  sVar7 = ZSTD_startingInputLength(in_ECX);
  local_8 = sVar7;
  if (sVar7 <= in_RDX) {
    if ((in_ECX == ZSTD_f_zstd1_magicless) ||
       (UVar3 = MEM_readLE32(in_stack_ffffffffffffff68), UVar3 == 0xfd2fb528)) {
      local_8 = ZSTD_frameHeaderSize_internal
                          (in_stack_ffffffffffffff98,
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),format_00);
      if (local_8 <= in_RDX) {
        *(int *)(in_RDI + 3) = (int)local_8;
        bVar1 = *(byte *)(in_RSI + (sVar7 - 1));
        uVar4 = (int)(uint)bVar1 >> 5 & 1;
        uVar9 = 0;
        UVar3 = 0;
        UVar8 = 0xffffffffffffffff;
        if ((bVar1 & 8) == 0) {
          local_50 = sVar7;
          if (uVar4 == 0) {
            local_50 = sVar7 + 1;
            uVar5 = ((int)(uint)*(byte *)(in_RSI + sVar7) >> 3) + 10;
            if (0x1f < uVar5) {
              return 0xfffffffffffffff0;
            }
            uVar9 = 1L << (sbyte)uVar5;
            uVar9 = (uVar9 >> 3) * (long)(int)(*(byte *)(in_RSI + sVar7) & 7) + uVar9;
          }
          switch(bVar1 & 3) {
          default:
            break;
          case 1:
            UVar3 = (U32)*(byte *)(in_RSI + local_50);
            local_50 = local_50 + 1;
            break;
          case 2:
            UVar2 = MEM_readLE16(in_stack_ffffffffffffff68);
            UVar3 = (U32)UVar2;
            local_50 = local_50 + 2;
            break;
          case 3:
            UVar3 = MEM_readLE32(in_stack_ffffffffffffff68);
            local_50 = local_50 + 4;
          }
          switch((int)(uint)bVar1 >> 6) {
          default:
            if (uVar4 != 0) {
              UVar8 = (U64)*(byte *)(in_RSI + local_50);
            }
            break;
          case 1:
            UVar2 = MEM_readLE16(in_stack_ffffffffffffff68);
            UVar8 = (U64)(int)(UVar2 + 0x100);
            break;
          case 2:
            UVar6 = MEM_readLE32(in_stack_ffffffffffffff68);
            UVar8 = (U64)UVar6;
            break;
          case 3:
            UVar8 = MEM_readLE64(in_stack_ffffffffffffff68);
          }
          if (uVar4 != 0) {
            uVar9 = UVar8;
          }
          *(undefined4 *)((long)in_RDI + 0x14) = 0;
          *in_RDI = UVar8;
          in_RDI[1] = uVar9;
          if (0x1ffff < uVar9) {
            uVar9 = 0x20000;
          }
          *(int *)(in_RDI + 2) = (int)uVar9;
          *(U32 *)((long)in_RDI + 0x1c) = UVar3;
          *(uint *)(in_RDI + 4) = (int)(uint)bVar1 >> 2 & 1;
          local_8 = 0;
        }
        else {
          local_8 = 0xfffffffffffffff2;
        }
      }
    }
    else {
      UVar3 = MEM_readLE32(in_stack_ffffffffffffff68);
      if ((UVar3 & 0xfffffff0) == 0x184d2a50) {
        if (in_RDX < 8) {
          local_8 = 8;
        }
        else {
          memset(in_RDI,0,0x28);
          UVar3 = MEM_readLE32(in_stack_ffffffffffffff68);
          *in_RDI = (ulong)UVar3;
          *(undefined4 *)((long)in_RDI + 0x14) = 1;
          local_8 = 0;
        }
      }
      else {
        local_8 = 0xfffffffffffffff6;
      }
    }
  }
  return local_8;
}

Assistant:

size_t ZSTD_getFrameHeader_advanced(ZSTD_frameHeader* zfhPtr, const void* src, size_t srcSize, ZSTD_format_e format)
{
    const BYTE* ip = (const BYTE*)src;
    size_t const minInputSize = ZSTD_startingInputLength(format);

    if (srcSize < minInputSize) return minInputSize;

    if ( (format != ZSTD_f_zstd1_magicless)
      && (MEM_readLE32(src) != ZSTD_MAGICNUMBER) ) {
        if ((MEM_readLE32(src) & 0xFFFFFFF0U) == ZSTD_MAGIC_SKIPPABLE_START) {
            /* skippable frame */
            if (srcSize < ZSTD_skippableHeaderSize)
                return ZSTD_skippableHeaderSize; /* magic number + frame length */
            memset(zfhPtr, 0, sizeof(*zfhPtr));
            zfhPtr->frameContentSize = MEM_readLE32((const char *)src + ZSTD_frameIdSize);
            zfhPtr->frameType = ZSTD_skippableFrame;
            return 0;
        }
        return ERROR(prefix_unknown);
    }

    /* ensure there is enough `srcSize` to fully read/decode frame header */
    {   size_t const fhsize = ZSTD_frameHeaderSize_internal(src, srcSize, format);
        if (srcSize < fhsize) return fhsize;
        zfhPtr->headerSize = (U32)fhsize;
    }

    {   BYTE const fhdByte = ip[minInputSize-1];
        size_t pos = minInputSize;
        U32 const dictIDSizeCode = fhdByte&3;
        U32 const checksumFlag = (fhdByte>>2)&1;
        U32 const singleSegment = (fhdByte>>5)&1;
        U32 const fcsID = fhdByte>>6;
        U64 windowSize = 0;
        U32 dictID = 0;
        U64 frameContentSize = ZSTD_CONTENTSIZE_UNKNOWN;
        if ((fhdByte & 0x08) != 0)
            return ERROR(frameParameter_unsupported); /* reserved bits, must be zero */

        if (!singleSegment) {
            BYTE const wlByte = ip[pos++];
            U32 const windowLog = (wlByte >> 3) + ZSTD_WINDOWLOG_ABSOLUTEMIN;
            if (windowLog > ZSTD_WINDOWLOG_MAX)
                return ERROR(frameParameter_windowTooLarge);
            windowSize = (1ULL << windowLog);
            windowSize += (windowSize >> 3) * (wlByte&7);
        }
        switch(dictIDSizeCode)
        {
            default: assert(0);  /* impossible */
            case 0 : break;
            case 1 : dictID = ip[pos]; pos++; break;
            case 2 : dictID = MEM_readLE16(ip+pos); pos+=2; break;
            case 3 : dictID = MEM_readLE32(ip+pos); pos+=4; break;
        }
        switch(fcsID)
        {
            default: assert(0);  /* impossible */
            case 0 : if (singleSegment) frameContentSize = ip[pos]; break;
            case 1 : frameContentSize = MEM_readLE16(ip+pos)+256; break;
            case 2 : frameContentSize = MEM_readLE32(ip+pos); break;
            case 3 : frameContentSize = MEM_readLE64(ip+pos); break;
        }
        if (singleSegment) windowSize = frameContentSize;

        zfhPtr->frameType = ZSTD_frame;
        zfhPtr->frameContentSize = frameContentSize;
        zfhPtr->windowSize = windowSize;
        zfhPtr->blockSizeMax = (unsigned) MIN(windowSize, ZSTD_BLOCKSIZE_MAX);
        zfhPtr->dictID = dictID;
        zfhPtr->checksumFlag = checksumFlag;
    }
    return 0;
}